

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

entry * __thiscall
mpt::unique_array<mpt::message_store::entry>::get
          (unique_array<mpt::message_store::entry> *this,long pos)

{
  long lVar1;
  iterator peVar2;
  long local_20;
  long pos_local;
  unique_array<mpt::message_store::entry> *this_local;
  
  if (pos < 0) {
    local_20 = length(this);
    local_20 = local_20 + pos;
    if (local_20 < 0) {
      return (entry *)0x0;
    }
  }
  else {
    lVar1 = length(this);
    local_20 = pos;
    if (lVar1 <= pos) {
      return (entry *)0x0;
    }
  }
  peVar2 = begin(this);
  return peVar2 + local_20;
}

Assistant:

T *get(long pos) const
	{
		if (pos < 0) {
			if ((pos += length()) < 0) {
				return 0;
			}
		}
		else if (pos >= length()) {
			return 0;
		}
		return begin() + pos;
	}